

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall
mkvparser::SegmentInfo::SegmentInfo
          (SegmentInfo *this,Segment *pSegment,longlong start,longlong size_,longlong element_start,
          longlong element_size)

{
  longlong element_size_local;
  longlong element_start_local;
  longlong size__local;
  longlong start_local;
  Segment *pSegment_local;
  SegmentInfo *this_local;
  
  this->m_pSegment = pSegment;
  this->m_start = start;
  this->m_size = size_;
  this->m_element_start = element_start;
  this->m_element_size = element_size;
  this->m_pMuxingAppAsUTF8 = (char *)0x0;
  this->m_pWritingAppAsUTF8 = (char *)0x0;
  this->m_pTitleAsUTF8 = (char *)0x0;
  return;
}

Assistant:

SegmentInfo::SegmentInfo(Segment* pSegment, long long start, long long size_,
                         long long element_start, long long element_size)
    : m_pSegment(pSegment),
      m_start(start),
      m_size(size_),
      m_element_start(element_start),
      m_element_size(element_size),
      m_pMuxingAppAsUTF8(NULL),
      m_pWritingAppAsUTF8(NULL),
      m_pTitleAsUTF8(NULL) {}